

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QSslErrorEntry>::emplace<QSslErrorEntry>
          (QPodArrayOps<QSslErrorEntry> *this,qsizetype i,QSslErrorEntry *args)

{
  QSslErrorEntry **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QSslErrorEntry QVar4;
  qsizetype qVar5;
  QSslErrorEntry *pQVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QSslErrorEntry>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QSslErrorEntry>).size == i) &&
       (qVar5 = QArrayDataPointer<QSslErrorEntry>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<QSslErrorEntry>), qVar5 != 0)) {
      (this->super_QArrayDataPointer<QSslErrorEntry>).ptr
      [(this->super_QArrayDataPointer<QSslErrorEntry>).size] = *args;
    }
    else {
      if ((i != 0) ||
         (qVar5 = QArrayDataPointer<QSslErrorEntry>::freeSpaceAtBegin
                            (&this->super_QArrayDataPointer<QSslErrorEntry>), qVar5 == 0))
      goto LAB_0011f7f7;
      (this->super_QArrayDataPointer<QSslErrorEntry>).ptr[-1] = *args;
      ppQVar1 = &(this->super_QArrayDataPointer<QSslErrorEntry>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QSslErrorEntry>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_0011f7f7:
  QVar4 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QSslErrorEntry>).size != 0);
  QArrayDataPointer<QSslErrorEntry>::detachAndGrow
            (&this->super_QArrayDataPointer<QSslErrorEntry>,where,1,(QSslErrorEntry **)0x0,
             (QArrayDataPointer<QSslErrorEntry> *)0x0);
  pQVar6 = createHole(this,where,i,1);
  *pQVar6 = QVar4;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }